

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

bool __thiscall Rml::Element::Focus(Element *this,bool focus_visible)

{
  Element *pEVar1;
  bool bVar2;
  ElementDocument *this_00;
  Context *this_01;
  
  if (((this->meta->computed_values).inherited.field_0x15 & 0x40) != 0) {
    this_00 = GetOwnerDocument(this);
    if (this_00 == (ElementDocument *)0x0) {
      this_01 = (Context *)0x0;
    }
    else {
      this_01 = ElementDocument::GetContext(this_00);
    }
    if ((this_01 != (Context *)0x0) &&
       (bVar2 = Context::OnFocusChange(this_01,this,focus_visible), bVar2)) {
      this->focus = (Element *)0x0;
      while (pEVar1 = this->parent, pEVar1 != (Element *)0x0) {
        pEVar1->focus = this;
        this = pEVar1;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Element::Focus(bool focus_visible)
{
	// Are we allowed focus?
	Style::Focus focus_property = meta->computed_values.focus();
	if (focus_property == Style::Focus::None)
		return false;

	// Ask our context if we can switch focus.
	Context* context = GetContext();
	if (context == nullptr)
		return false;

	if (!context->OnFocusChange(this, focus_visible))
		return false;

	// Set this as the end of the focus chain.
	focus = nullptr;

	// Update the focus chain up the hierarchy.
	Element* element = this;
	while (Element* parent = element->GetParentNode())
	{
		parent->focus = element;
		element = parent;
	}

	return true;
}